

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall
xemmai::t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
          (t_shared_lock_with_safe_region<std::shared_mutex> *this,shared_mutex *a_mutex)

{
  t_safe_region local_1a [2];
  t_safe_region region;
  shared_mutex *psStack_18;
  shared_mutex *a_mutex_local;
  t_shared_lock_with_safe_region<std::shared_mutex> *this_local;
  
  psStack_18 = a_mutex;
  std::shared_lock<std::shared_mutex>::shared_lock
            (&this->super_shared_lock<std::shared_mutex>,a_mutex);
  t_safe_region::t_safe_region(local_1a);
  std::shared_lock<std::shared_mutex>::lock(&this->super_shared_lock<std::shared_mutex>);
  t_safe_region::~t_safe_region(local_1a);
  return;
}

Assistant:

t_shared_lock_with_safe_region(T& a_mutex) : std::shared_lock<T>(a_mutex, std::defer_lock)
	{
		t_safe_region region;
		this->lock();
	}